

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogSenderStdOstream.h
# Opt level: O0

ssize_t nowtech::log::
        SenderStdOstream<nowtech::log::AppInterfaceStd<(unsigned_char)'\x02',_false,_100UL>,_nowtech::log::ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)'d',_true,_false>,_123UL,_123U>
        ::send(int __fd,void *__buf,size_t __n,int __flags)

{
  ssize_t in_RAX;
  undefined4 in_register_0000003c;
  
  if (sStream != (ostream *)0x0) {
    in_RAX = std::ostream::write((char *)sStream,CONCAT44(in_register_0000003c,__fd));
  }
  return in_RAX;
}

Assistant:

static void send(char const * const aBegin, char const * const aEnd) {
    try {
      if(sStream != nullptr) {
        sStream->write(aBegin, aEnd - aBegin);
      }
      else { // nothing to do
      }
    } catch(...) {
      tAppInterface::error(Exception::cSenderError);
    }
  }